

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,IdentifierExpr *node)

{
  bool bVar1;
  shared_ptr<mocker::ast::VarDecl> decl;
  element_type *local_18;
  
  bVar1 = std::operator==(&((node->identifier).
                            super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->val,"this");
  if (!bVar1) {
    local_18 = (node->identifier).
               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__detail::
    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)this->associatedDecl,(key_type *)&local_18);
    std::dynamic_pointer_cast<mocker::ast::VarDecl,mocker::ast::Declaration>
              ((shared_ptr<mocker::ast::Declaration> *)&decl);
    if (decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      __assert_fail("decl",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/preprocessor.cpp"
                    ,0x74,
                    "virtual void mocker::RenameASTIdentifiers::operator()(ast::IdentifierExpr &) const"
                   );
    }
    std::__cxx11::string::_M_assign
              ((string *)
               &((node->identifier).
                 super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                val);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void operator()(ast::IdentifierExpr &node) const override {
    if (node.identifier->val == "this")
      return;
    auto decl = std::dynamic_pointer_cast<ast::VarDecl>(
        associatedDecl.at(node.identifier->getID()));
    assert(decl);
    node.identifier->val = decl->decl->identifier->val;
  }